

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealwrap.cpp
# Opt level: O0

ssize_t __thiscall
Vault::Sys::Sealwrap::read_abi_cxx11_(Sealwrap *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url local_38;
  Sealwrap *local_18;
  Sealwrap *this_local;
  
  local_18 = (Sealwrap *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)local_18;
  this_local = this;
  getUrl_abi_cxx11_(&local_38,local_18);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Sealwrap::read() {
  return HttpConsumer::get(client_, getUrl());
}